

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O3

bool __thiscall chipemu::implementation::nmos::get_node(nmos *this,uint id)

{
  if (id - 1 < (uint)this->desc_nodes_count) {
    return (bool)(((byte)(this->nodes).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start
                         [(this->node_offsets).
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[id]] & 4) >> 2);
  }
  return false;
}

Assistant:

bool
nmos::get_node(unsigned id) const noexcept
{
    if (id > 0 and id <= node_count()) {
        return (*(node_addr(id))) & node_is_high;
    }
    else {
        return false;
    }
}